

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_cv.hpp
# Opt level: O0

__sighandler_t __thiscall
pstore::signal_cv::signal(signal_cv *this,int __sig,__sighandler_t __handler)

{
  signal_cv *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (__sighandler_t)(ulong)(uint)(this->signal_).super___atomic_base<int>._M_i;
}

Assistant:

int signal () const { return signal_.load (); }